

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O2

void __thiscall IMLE::predictInverseSingle(IMLE *this,X *x)

{
  ArrayZ *this_00;
  ArrayZZ *this_01;
  Mat *this_02;
  ArrayScal *this_03;
  double dVar1;
  pointer pdVar2;
  pointer pFVar3;
  pointer piVar4;
  int iVar5;
  double *pdVar6;
  long lVar7;
  int j_1;
  long lVar8;
  int j;
  long lVar9;
  ResScalar RVar10;
  string local_120;
  Mat *local_100;
  long local_f8;
  double *pdStack_f0;
  Mat *local_e8;
  double local_e0;
  ArrayZZ *local_d0;
  Mat *local_c8;
  Vec *local_c0;
  X *local_b8;
  long local_b0;
  ZZ invVar;
  value_type local_70;
  Vec *local_58;
  Scal local_50;
  ZZ sumInvRj;
  
  local_b8 = x;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,__1,_0> *)&sumInvRj,
             (DenseStorage<double,__1,__1,__1,_0> *)&this->zeroZZ);
  local_c8 = &this->sumInvRzj;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::setZero
            (&local_c8->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,
             (long)this->d,1);
  this_00 = &this->invPredictions;
  std::
  vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::clear(this_00);
  this_01 = &this->invPredictionsVar;
  std::
  vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::clear(this_01);
  pdVar2 = (this->invPredictionsWeight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->invPredictionsWeight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar2) {
    (this->invPredictionsWeight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar2;
  }
  local_c0 = &this->sum_p_x;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&local_c0->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,1);
  *(this->sum_p_x).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       0.0;
  local_d0 = &this->iInvRj;
  std::
  vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::clear(local_d0);
  std::
  vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::reserve(local_d0,(long)this->M);
  this_02 = &this->invRzj;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
            (&this_02->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,
             (long)this->d,(long)this->M);
  local_58 = &this->zInvRzj;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&local_58->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,(long)this->M
            );
  if ((local_b8->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows ==
      (long)this->D) {
    lVar8 = 0x178;
    lVar7 = 0;
    for (lVar9 = 0; lVar9 < this->M; lVar9 = lVar9 + 1) {
      local_120.field_2._8_8_ =
           LinearExpert::queryX
                     ((LinearExpert *)
                      ((long)(this->experts).
                             super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                             .
                             super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar8 + -0x178),local_b8);
      pFVar3 = (this->experts).
               super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
               .
               super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_120._M_dataplus._M_p = (pointer)((long)&(pFVar3->super_LinearExpert).H + lVar8);
      local_120._M_string_length = *(size_type *)((long)&(pFVar3->super_LinearExpert).Sh + lVar8);
      local_120.field_2._M_allocated_capacity =
           *(undefined8 *)((long)&(pFVar3->super_LinearExpert).Sz + lVar8);
      local_b0 = lVar7;
      local_50 = (Scal)local_120.field_2._8_8_;
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&invVar,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                  *)&local_120);
      std::
      vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
      ::push_back(local_d0,(value_type *)&invVar);
      free(invVar.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data)
      ;
      invVar.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
           (double *)
           ((long)&(((this->iInvRj).
                     super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                   super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                   m_data + local_b0);
      invVar.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
           (long)&(((this->experts).
                    super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                    .
                    super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                    ._M_impl.super__Vector_impl_data._M_start)->super_LinearExpert).d + lVar8;
      local_120._M_string_length =
           (this->invRzj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
           .m_rows;
      local_120._M_dataplus._M_p =
           (pointer)((this->invRzj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                     .m_storage.m_data + local_120._M_string_length * lVar9);
      local_100 = (Mat *)0x0;
      local_120.field_2._8_8_ = this_02;
      local_f8 = lVar9;
      pdStack_f0 = (double *)local_120._M_string_length;
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)&local_120,
                 (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
                  *)&invVar);
      local_120._M_string_length =
           (this->invRzj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
           .m_rows;
      local_120._M_dataplus._M_p =
           (pointer)((this->invRzj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                     .m_storage.m_data + local_120._M_string_length * lVar9);
      local_100 = (Mat *)0x0;
      local_120.field_2._8_8_ = this_02;
      local_f8 = lVar9;
      pdStack_f0 = (double *)local_120._M_string_length;
      RVar10 = Eigen::internal::
               dot_nocheck<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_false>
               ::run((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                     ((long)&(((this->experts).
                               super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                               .
                               super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                               ._M_impl.super__Vector_impl_data._M_start)->super_LinearExpert).d +
                     lVar8),(MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
                             *)&local_120);
      lVar7 = local_b0;
      (local_58->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
      [lVar9] = RVar10;
      pdVar6 = (local_c0->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
               m_data;
      *pdVar6 = local_50 + *pdVar6;
      Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator+=
                ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&sumInvRj,
                 (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                 ((long)&(((local_d0->
                           super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                           )._M_impl.super__Vector_impl_data._M_start)->
                         super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage
                         .m_data + local_b0));
      local_120._M_string_length =
           (this->invRzj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
           .m_rows;
      local_120._M_dataplus._M_p =
           (pointer)((this->invRzj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                     .m_storage.m_data + local_120._M_string_length * lVar9);
      local_100 = (Mat *)0x0;
      invVar.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
           (this->sumInvRzj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_data;
      invVar.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
           (this->sumInvRzj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_rows;
      local_120.field_2._8_8_ = this_02;
      local_f8 = lVar9;
      pdStack_f0 = (double *)local_120._M_string_length;
      Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>>::operator+=
                ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>> *)&invVar,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_> *
                 )&local_120);
      lVar8 = lVar8 + 0x308;
      lVar7 = lVar7 + 0x18;
    }
  }
  else {
    std::__cxx11::string::string
              ((string *)&local_120,
               "IMLE::predict: query dimension does not match output dimension!!",
               (allocator *)&invVar);
    message(this,&local_120);
    std::__cxx11::string::_M_dispose();
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
              (&local_c0->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,1);
  }
  this_03 = &this->invPredictionsWeight;
  pdVar6 = (this->sum_p_x).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data;
  this->sumAll = *pdVar6 + this->pNoiseModelX;
  dVar1 = *pdVar6;
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    dVar1 = (this->param).multiValuedSignificance;
    if ((dVar1 != 0.0) || (NAN(dVar1))) {
      local_120._M_dataplus._M_p = (pointer)&sumInvRj;
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      PlainObjectBase<Eigen::Inverse<Eigen::Matrix<double,_1,_1,0,_1,_1>>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&invVar,
                 (DenseBase<Eigen::Inverse<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)&local_120
                );
      local_120._M_string_length =
           (size_type)
           (this->sumInvRzj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_data;
      local_120.field_2._M_allocated_capacity =
           (this->sumInvRzj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_rows;
      local_100 = local_c8;
      local_f8 = 0;
      pdStack_f0 = (double *)0x0;
      local_120._M_dataplus._M_p = (pointer)&invVar;
      local_e8 = (Mat *)local_120.field_2._M_allocated_capacity;
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
      PlainObjectBase<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,0>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_70,
                 (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>_>
                  *)&local_120);
      std::
      vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::push_back(this_00,(value_type *)&local_70);
      free(local_70.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data);
      local_120.field_2._8_8_ = this->sumAll;
      local_120._M_string_length =
           invVar.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows;
      local_120.field_2._M_allocated_capacity =
           invVar.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols;
      local_120._M_dataplus._M_p = (pointer)&invVar;
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_70,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                  *)&local_120);
      std::
      vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
      ::push_back(this_01,&local_70);
      free(local_70.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data);
      local_120._M_dataplus._M_p =
           (pointer)(*(this->sum_p_x).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                      .m_storage.m_data / this->sumAll);
      std::vector<double,_std::allocator<double>_>::push_back(this_03,(value_type *)&local_120);
      free(invVar.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data)
      ;
      this->nInvSolFound = 1;
      piVar4 = (this->sNearestInv).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((this->sNearestInv).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish != piVar4) {
        (this->sNearestInv).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = piVar4;
      }
      std::vector<int,_std::allocator<int>_>::resize(&this->sNearestInv,(long)this->M,0);
      goto LAB_0018c42f;
    }
    std::
    vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::reserve(this_00,(long)this->M);
    std::
    vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
    ::reserve(this_01,(long)this->M);
    std::vector<double,_std::allocator<double>_>::reserve(this_03,(long)this->M);
    lVar8 = 0x140;
    for (lVar7 = 0; iVar5 = this->M, lVar7 < iVar5; lVar7 = lVar7 + 1) {
      std::
      vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::push_back(this_00,(value_type *)
                          ((long)&(((this->experts).
                                    super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                                    .
                                    super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->super_LinearExpert).
                                  Lambda + lVar8 + 0x10U));
      pdVar6 = (double *)
               ((long)&(((this->experts).
                         super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                         .
                         super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                         ._M_impl.super__Vector_impl_data._M_start)->super_LinearExpert).d + lVar8);
      local_120._M_string_length = (size_type)(pdVar6 + 0x14);
      local_e0 = *pdVar6;
      local_100 = (Mat *)(this->pNoiseModelX + local_e0);
      local_120.field_2._M_allocated_capacity = (size_type)pdVar6[0x15];
      local_120.field_2._8_8_ = pdVar6[0x16];
      pdStack_f0 = (double *)local_120.field_2._M_allocated_capacity;
      local_e8 = (Mat *)local_120.field_2._8_8_;
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&invVar,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                  *)&local_120);
      std::
      vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
      ::push_back(this_01,(value_type *)&invVar);
      free(invVar.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data)
      ;
      local_120._M_dataplus._M_p =
           (pointer)(*(double *)
                      ((long)&(((this->experts).
                                super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                                .
                                super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                                ._M_impl.super__Vector_impl_data._M_start)->super_LinearExpert).d +
                      lVar8) / this->sumAll);
      std::vector<double,_std::allocator<double>_>::push_back(this_03,(value_type *)&local_120);
      lVar8 = lVar8 + 0x308;
    }
  }
  else {
    std::
    vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::push_back(this_00,&this->zeroZ);
    std::
    vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
    ::push_back(this_01,&this->infinityZZ);
    local_120._M_dataplus._M_p = (pointer)0x0;
    std::vector<double,_std::allocator<double>_>::push_back(this_03,(value_type *)&local_120);
    iVar5 = 1;
  }
  this->nInvSolFound = iVar5;
LAB_0018c42f:
  free(sumInvRj.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  return;
}

Assistant:

IMLE_CLASS_TEMPLATE
void IMLE_base::predictInverseSingle(X const &x)
{
    // Aux variables
    ZZ sumInvRj = zeroZZ;
    sumInvRzj.setZero(d,1);

    // Clear predict data structure
    invPredictions.clear();
    invPredictionsVar.clear();
    invPredictionsWeight.clear();

    sum_p_x.resize(1);
    sum_p_x(0) = 0.0;
    iInvRj.clear(); iInvRj.reserve(M);
    invRzj.resize(d,M);
    zInvRzj.resize(M);

#ifdef IMLE_NO_TEMPLATES
    // Check dimensions
    if( x.size() != D )
    {
        message("IMLE::predict: query dimension does not match output dimension!!");

        sum_p_x.setZero(1);
    }
    else
#endif
        for(int j = 0; j < M; j++)
        {
            Scal p_x = experts[j].queryX(x);

            // These are needed for multivalued inverse prediction
            iInvRj.push_back(experts[j].getPredZInvVar() * p_x );
            invRzj.col(j) = iInvRj[j] * experts[j].getPredZ();
            zInvRzj(j) = experts[j].getPredZ().dot( invRzj.col(j) );

            sum_p_x(0) += p_x;
            sumInvRj += iInvRj[j];
            sumInvRzj.col(0) += invRzj.col(j);
        }
    sumAll = sum_p_x(0) + pNoiseModelX;

    if(sum_p_x(0) == 0.0)  // This happens when a prediction is sought too far from the current mixture
    {
        invPredictions.push_back(zeroZ);
        invPredictionsVar.push_back( infinityZZ );
        invPredictionsWeight.push_back(0.0);

        nInvSolFound = 1;
        return;
    }
    else if( param.multiValuedSignificance == 0.0 )
    {
        invPredictions.reserve(M);
        invPredictionsVar.reserve(M);
        invPredictionsWeight.reserve(M);

        for(int j = 0; j < M; j++)
        {
            invPredictions.push_back( experts[j].getPredZ() );
            invPredictionsVar.push_back( experts[j].getPredZVar() *(experts[j].get_p_x() + pNoiseModelX) / experts[j].get_p_x() );
            invPredictionsWeight.push_back(experts[j].get_p_x() / sumAll);
        }

        nInvSolFound = M;
        return;
    }
    else
    {
        ZZ invVar = sumInvRj.inverse();

        invPredictions.push_back( invVar * sumInvRzj.col(0) );
        invPredictionsVar.push_back( invVar * sumAll );
        invPredictionsWeight.push_back(sum_p_x(0) / sumAll );
    }

    nInvSolFound = 1;
    sNearestInv.clear();
    sNearestInv.resize(M,0);
}